

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O2

int Gia_QbfAddCofactor(Qbf_Man_t *p,Gia_Man_t *pCof)

{
  int iVar1;
  Cnf_Dat_t *p_00;
  int iVar2;
  int firstPiVar;
  long lVar3;
  
  iVar2 = 1;
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(pCof,8,0,1,0,0);
  firstPiVar = (pCof->nRegs - pCof->vCis->nSize) + p_00->nVars;
  p_00->pMan = (Aig_Man_t *)0x0;
  iVar1 = sat_solver_nvars(p->pSatSyn);
  Cnf_SpecialDataLift(p_00,iVar1,firstPiVar,(p->pGia->vCis->nSize + firstPiVar) - p->pGia->nRegs);
  lVar3 = 0;
  do {
    if (p_00->nClauses <= lVar3) goto LAB_005e857f;
    iVar1 = sat_solver_addclause(p->pSatSyn,p_00->pClauses[lVar3],p_00->pClauses[lVar3 + 1]);
    lVar3 = lVar3 + 1;
  } while (iVar1 != 0);
  iVar2 = 0;
LAB_005e857f:
  Cnf_DataFree(p_00);
  return iVar2;
}

Assistant:

int Gia_QbfAddCofactor( Qbf_Man_t * p, Gia_Man_t * pCof )
{
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pCof, 8, 0, 1, 0, 0 );
    int i, useold = 0;
    int iFirstVar = useold ? sat_solver_nvars(p->pSatSyn) + pCnf->nVars - Gia_ManPiNum(pCof) : pCnf->nVars - Gia_ManPiNum(pCof); //-1   
    pCnf->pMan = NULL;
    
    if (useold)    
        Cnf_DataLift( pCnf, sat_solver_nvars(p->pSatSyn) );
    else
        Cnf_SpecialDataLift( pCnf, sat_solver_nvars(p->pSatSyn), iFirstVar, iFirstVar + Gia_ManPiNum(p->pGia) );

    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( p->pSatSyn, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
        {
            Cnf_DataFree( pCnf );
            return 0;
        }
    Cnf_DataFree( pCnf );
    // add connection clauses
    if (useold)
           for ( i = 0; i < Gia_ManPiNum(p->pGia); i++ )
            if ( !sat_solver_add_buffer( p->pSatSyn, i, iFirstVar+i, 0 ) )
                return 0;
    return 1;
}